

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int zisofs_write_to_temp(archive_write *a,void *buff,size_t s)

{
  uchar uVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  long lVar7;
  size_t size;
  int64_t diff;
  uchar *nonzeroend;
  uchar *nonzero;
  int r;
  int flush;
  size_t csize;
  size_t avail;
  z_stream *zstrm;
  uchar *b;
  isofile *file;
  iso9660_conflict *iso9660;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  pvVar2 = a->format_data;
  lVar3 = *(long *)((long)pvVar2 + 0x10);
  puVar6 = wb_buffptr(a);
  *(uchar **)((long)pvVar2 + 0x260) = puVar6;
  *(int *)((long)pvVar2 + 0x268) = (int)*(undefined8 *)((long)a->format_data + 0x102e0);
  zstrm = (z_stream *)buff;
  iso9660 = (iso9660_conflict *)s;
  do {
    csize = 0x8000 - *(long *)((long)pvVar2 + 600);
    if (iso9660 < csize) {
      csize = (size_t)iso9660;
      nonzero._4_4_ = 0;
    }
    else {
      nonzero._4_4_ = 4;
    }
    *(size_t *)((long)pvVar2 + 0x2c0) = *(long *)((long)pvVar2 + 0x2c0) - csize;
    if (*(long *)((long)pvVar2 + 0x2c0) < 1) {
      nonzero._4_4_ = 4;
    }
    ((z_streamp)((long)pvVar2 + 0x248))->next_in = (Bytef *)zstrm;
    *(int *)((long)pvVar2 + 0x250) = (int)csize;
    if ((char)(*(char *)((long)pvVar2 + 0x1d8) << 5) < '\0') {
      nonzeroend = (uchar *)zstrm;
      do {
        if ((uchar *)((long)&zstrm->next_in + csize) <= nonzeroend) goto LAB_00206c67;
        uVar1 = *nonzeroend;
        nonzeroend = nonzeroend + 1;
      } while (uVar1 == '\0');
      *(byte *)((long)pvVar2 + 0x1d8) = *(byte *)((long)pvVar2 + 0x1d8) & 0xfb;
    }
LAB_00206c67:
    zstrm = (z_stream *)((long)&zstrm->next_in + csize);
    iso9660 = (iso9660_conflict *)((long)iso9660 - csize);
    if (((nonzero._4_4_ == 4) && ((char)(*(char *)((long)pvVar2 + 0x1d8) << 5) < '\0')) &&
       (csize + *(long *)((long)pvVar2 + 600) == 0x8000)) {
      if (*(long *)((long)pvVar2 + 0x240) != *(long *)(*(long *)(lVar3 + 0xb0) + 8)) {
        iVar4 = wb_set_offset(a,**(long **)(lVar3 + 0xb0) + *(long *)((long)pvVar2 + 0x240));
        if (iVar4 != 0) {
          return iVar4;
        }
        lVar7 = *(long *)(*(long *)(lVar3 + 0xb0) + 8) - *(long *)((long)pvVar2 + 0x240);
        *(long *)(*(long *)(lVar3 + 0xb0) + 8) = *(long *)(*(long *)(lVar3 + 0xb0) + 8) - lVar7;
        *(long *)((long)pvVar2 + 0x238) = *(long *)((long)pvVar2 + 0x238) - lVar7;
      }
      *(undefined4 *)((long)pvVar2 + 0x250) = 0;
    }
    while (*(int *)((long)pvVar2 + 0x250) != 0) {
      lVar7 = *(long *)((long)pvVar2 + 0x270);
      uVar5 = cm_zlib_deflate((z_streamp)((long)pvVar2 + 0x248),nonzero._4_4_);
      if (1 < uVar5) {
        archive_set_error(&a->archive,-1,"Compression failed: deflate() call returned status %d",
                          (ulong)uVar5);
        return -0x1e;
      }
      size = *(long *)((long)pvVar2 + 0x270) - lVar7;
      iVar4 = wb_consume(a,size);
      if (iVar4 != 0) {
        return -0x1e;
      }
      *(size_t *)((long)pvVar2 + 0x238) = size + *(long *)((long)pvVar2 + 0x238);
      lVar7 = *(long *)(*(long *)((long)pvVar2 + 0x10) + 0xb0);
      *(size_t *)(lVar7 + 8) = size + *(long *)(lVar7 + 8);
      puVar6 = wb_buffptr(a);
      *(uchar **)((long)pvVar2 + 0x260) = puVar6;
      *(int *)((long)pvVar2 + 0x268) = (int)*(undefined8 *)((long)a->format_data + 0x102e0);
    }
    if (nonzero._4_4_ == 4) {
      *(int *)((long)pvVar2 + 0x234) = *(int *)((long)pvVar2 + 0x234) + 1;
      archive_le32enc((void *)(*(long *)((long)pvVar2 + 0x220) +
                              (long)*(int *)((long)pvVar2 + 0x234) * 4),
                      (uint32_t)*(undefined8 *)((long)pvVar2 + 0x238));
      iVar4 = zisofs_init_zstream(a);
      if (iVar4 != 0) {
        return -0x1e;
      }
      *(byte *)((long)pvVar2 + 0x1d8) = *(byte *)((long)pvVar2 + 0x1d8) & 0xfb | 4;
      *(undefined8 *)((long)pvVar2 + 0x240) = *(undefined8 *)(*(long *)(lVar3 + 0xb0) + 8);
    }
    if (iso9660 == (iso9660_conflict *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
zisofs_write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file = iso9660->cur_file;
	const unsigned char *b;
	z_stream *zstrm;
	size_t avail, csize;
	int flush, r;

	zstrm = &(iso9660->zisofs.stream);
	zstrm->next_out = wb_buffptr(a);
	zstrm->avail_out = (uInt)wb_remaining(a);
	b = (const unsigned char *)buff;
	do {
		avail = ZF_BLOCK_SIZE - zstrm->total_in;
		if (s < avail) {
			avail = s;
			flush = Z_NO_FLUSH;
		} else
			flush = Z_FINISH;
		iso9660->zisofs.remaining -= avail;
		if (iso9660->zisofs.remaining <= 0)
			flush = Z_FINISH;

		zstrm->next_in = (Bytef *)(uintptr_t)(const void *)b;
		zstrm->avail_in = (uInt)avail;

		/*
		 * Check if current data block are all zero.
		 */
		if (iso9660->zisofs.allzero) {
			const unsigned char *nonzero = b;
			const unsigned char *nonzeroend = b + avail;

			while (nonzero < nonzeroend)
				if (*nonzero++) {
					iso9660->zisofs.allzero = 0;
					break;
				}
		}
		b += avail;
		s -= avail;

		/*
		 * If current data block are all zero, we do not use
		 * compressed data.
		 */
		if (flush == Z_FINISH && iso9660->zisofs.allzero &&
		    avail + zstrm->total_in == ZF_BLOCK_SIZE) {
			if (iso9660->zisofs.block_offset !=
			    file->cur_content->size) {
				int64_t diff;

				r = wb_set_offset(a,
				    file->cur_content->offset_of_temp +
				        iso9660->zisofs.block_offset);
				if (r != ARCHIVE_OK)
					return (r);
				diff = file->cur_content->size -
				    iso9660->zisofs.block_offset;
				file->cur_content->size -= diff;
				iso9660->zisofs.total_size -= diff;
			}
			zstrm->avail_in = 0;
		}

		/*
		 * Compress file data.
		 */
		while (zstrm->avail_in > 0) {
			csize = zstrm->total_out;
			r = deflate(zstrm, flush);
			switch (r) {
			case Z_OK:
			case Z_STREAM_END:
				csize = zstrm->total_out - csize;
				if (wb_consume(a, csize) != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
				iso9660->zisofs.total_size += csize;
				iso9660->cur_file->cur_content->size += csize;
				zstrm->next_out = wb_buffptr(a);
				zstrm->avail_out = (uInt)wb_remaining(a);
				break;
			default:
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Compression failed:"
				    " deflate() call returned status %d",
				    r);
				return (ARCHIVE_FATAL);
			}
		}

		if (flush == Z_FINISH) {
			/*
			 * Save the information of one zisofs block.
			 */
			iso9660->zisofs.block_pointers_idx ++;
			archive_le32enc(&(iso9660->zisofs.block_pointers[
			    iso9660->zisofs.block_pointers_idx]),
				(uint32_t)iso9660->zisofs.total_size);
			r = zisofs_init_zstream(a);
			if (r != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			iso9660->zisofs.allzero = 1;
			iso9660->zisofs.block_offset = file->cur_content->size;
		}
	} while (s);

	return (ARCHIVE_OK);
}